

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O0

void __thiscall t_html_generator::generate_program_toc_row(t_html_generator *this,t_program *tprog)

{
  pointer *this_00;
  pointer *this_01;
  pointer *this_02;
  bool bVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  vector<t_service_*,_std::allocator<t_service_*>_> *pvVar5;
  reference pptVar6;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar7;
  vector<t_enum_*,_std::allocator<t_enum_*>_> *pvVar8;
  reference pptVar9;
  undefined4 extraout_var;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> *pvVar10;
  reference pptVar11;
  vector<t_struct_*,_std::allocator<t_struct_*>_> *pvVar12;
  reference pptVar13;
  undefined4 extraout_var_00;
  vector<t_const_*,_std::allocator<t_const_*>_> *pvVar14;
  reference pptVar15;
  reference ppVar16;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *con_iter_1;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9f8;
  string local_9b8;
  string local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  undefined1 local_8d8 [8];
  string html_4;
  string name_4;
  __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_> local_888;
  iterator con_iter;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  const_html;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *data_type;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_808;
  string local_7c8;
  string local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  undefined1 local_6e8 [8];
  string html_3;
  string name_3;
  __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_> local_698;
  iterator o_iter;
  vector<t_struct_*,_std::allocator<t_struct_*>_> objects;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_668;
  string local_628;
  string local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  undefined1 local_548 [8];
  string html_2;
  string name_2;
  __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_> local_4f8
  ;
  iterator td_iter;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> typedefs;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c8;
  string local_488;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  undefined1 local_3a8 [8];
  string html_1;
  string name_1;
  __normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_358;
  iterator en_iter;
  vector<t_enum_*,_std::allocator<t_enum_*>_> enums;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  data_types;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *html_iter;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  string local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [8];
  string html;
  string fn_name;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_128;
  iterator fn_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fn_html;
  string local_b8;
  undefined1 local_98 [8];
  string name;
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_> local_68;
  iterator sv_iter;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  undefined1 local_38 [8];
  string fname;
  t_program *tprog_local;
  t_html_generator *this_local;
  
  fname.field_2._8_8_ = tprog;
  psVar3 = t_program::get_name_abi_cxx11_(tprog);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 psVar3,".html");
  poVar4 = std::operator<<((ostream *)&this->f_out_,"<tr>");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"<td>");
  psVar3 = t_program::get_name_abi_cxx11_((t_program *)fname.field_2._8_8_);
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  std::operator<<(poVar4,"</td><td>");
  pvVar5 = t_program::get_services((t_program *)fname.field_2._8_8_);
  bVar1 = std::vector<t_service_*,_std::allocator<t_service_*>_>::empty(pvVar5);
  if (!bVar1) {
    pvVar5 = t_program::get_services((t_program *)fname.field_2._8_8_);
    std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
              ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter,pvVar5);
    __gnu_cxx::
    __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
    __normal_iterator(&local_68);
    local_68._M_current =
         (t_service **)
         std::vector<t_service_*,_std::allocator<t_service_*>_>::begin
                   ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
    while( true ) {
      name.field_2._8_8_ =
           std::vector<t_service_*,_std::allocator<t_service_*>_>::end
                     ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_68,
                         (__normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                          *)((long)&name.field_2 + 8));
      if (!bVar1) break;
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                ::operator*(&local_68);
      (*(this->super_t_generator)._vptr_t_generator[0x1a])(local_98,this,*pptVar6);
      poVar4 = std::operator<<((ostream *)&this->f_out_,"<a href=\"");
      std::__cxx11::string::string
                ((string *)&fn_html._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (string *)local_38);
      make_file_link(&local_b8,this,
                     (string *)&fn_html._M_t._M_impl.super__Rb_tree_header._M_node_count);
      poVar4 = std::operator<<(poVar4,(string *)&local_b8);
      poVar4 = std::operator<<(poVar4,"#Svc_");
      poVar4 = std::operator<<(poVar4,(string *)local_98);
      poVar4 = std::operator<<(poVar4,"\">");
      poVar4 = std::operator<<(poVar4,(string *)local_98);
      poVar4 = std::operator<<(poVar4,"</a><br/>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string
                ((string *)&fn_html._M_t._M_impl.super__Rb_tree_header._M_node_count);
      poVar4 = std::operator<<((ostream *)&this->f_out_,"<ul>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                ::operator*(&local_68);
      __x = t_service::get_functions(*pptVar6);
      std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
                ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter,__x);
      __gnu_cxx::
      __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
      __normal_iterator(&local_128);
      local_128._M_current =
           (t_function **)
           std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                     ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
      while( true ) {
        fn_name.field_2._8_8_ =
             std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                       ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
        bVar1 = __gnu_cxx::operator!=
                          (&local_128,
                           (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&fn_name.field_2 + 8));
        if (!bVar1) break;
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_128);
        psVar3 = t_function::get_name_abi_cxx11_(*pptVar7);
        std::__cxx11::string::string((string *)(html.field_2._M_local_buf + 8),(string *)psVar3);
        std::__cxx11::string::string((string *)&local_298,(string *)local_38);
        make_file_link(&local_278,this,&local_298);
        std::operator+(&local_258,"<li><a href=\"",&local_278);
        std::operator+(&local_238,&local_258,"#Fn_");
        std::operator+(&local_218,&local_238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        std::operator+(&local_1f8,&local_218,"_");
        std::operator+(&local_1d8,&local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&html.field_2 + 8));
        std::operator+(&local_1b8,&local_1d8,"\">");
        std::operator+(&local_198,&local_1b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&html.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_178,&local_198,"</a></li>");
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_298);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&html.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
        std::
        map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,&local_2d8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_2d8);
        std::__cxx11::string::~string((string *)local_178);
        std::__cxx11::string::~string((string *)(html.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
        ::operator++(&local_128);
      }
      this_00 = &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      __end3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)this_00);
      html_iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)this_00);
      while( true ) {
        bVar1 = std::operator!=(&__end3,(_Self *)&html_iter);
        if (!bVar1) break;
        ppVar16 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*(&__end3);
        poVar4 = std::operator<<((ostream *)&this->f_out_,(string *)&ppVar16->second);
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end3);
      }
      poVar4 = std::operator<<((ostream *)&this->f_out_,"</ul>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
                ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_98);
      __gnu_cxx::
      __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
      operator++(&local_68);
    }
    std::vector<t_service_*,_std::allocator<t_service_*>_>::~vector
              ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
  }
  poVar4 = std::operator<<((ostream *)&this->f_out_,"</td>");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,"<td>");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  pvVar8 = t_program::get_enums((t_program *)fname.field_2._8_8_);
  bVar1 = std::vector<t_enum_*,_std::allocator<t_enum_*>_>::empty(pvVar8);
  if (!bVar1) {
    pvVar8 = t_program::get_enums((t_program *)fname.field_2._8_8_);
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter,pvVar8);
    __gnu_cxx::__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
    __normal_iterator(&local_358);
    local_358._M_current =
         (t_enum **)
         std::vector<t_enum_*,_std::allocator<t_enum_*>_>::begin
                   ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
    while( true ) {
      name_1.field_2._8_8_ =
           std::vector<t_enum_*,_std::allocator<t_enum_*>_>::end
                     ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_358,
                         (__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
                          *)((long)&name_1.field_2 + 8));
      if (!bVar1) break;
      pptVar9 = __gnu_cxx::
                __normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
                operator*(&local_358);
      iVar2 = (*((*pptVar9)->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::__cxx11::string::string
                ((string *)(html_1.field_2._M_local_buf + 8),(string *)CONCAT44(extraout_var,iVar2))
      ;
      std::__cxx11::string::string((string *)&local_488,(string *)local_38);
      make_file_link(&local_468,this,&local_488);
      std::operator+(&local_448,"<a href=\"",&local_468);
      std::operator+(&local_428,&local_448,"#Enum_");
      std::operator+(&local_408,&local_428,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&html_1.field_2 + 8));
      std::operator+(&local_3e8,&local_408,"\">");
      std::operator+(&local_3c8,&local_3e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&html_1.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                     &local_3c8,"</a>");
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_488);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_4c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&html_1.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8);
      std::
      map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,&local_4c8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_4c8);
      std::__cxx11::string::~string((string *)local_3a8);
      std::__cxx11::string::~string((string *)(html_1.field_2._M_local_buf + 8));
      __gnu_cxx::__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
      operator++(&local_358);
    }
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::~vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
  }
  pvVar10 = t_program::get_typedefs((t_program *)fname.field_2._8_8_);
  bVar1 = std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::empty(pvVar10);
  if (!bVar1) {
    pvVar10 = t_program::get_typedefs((t_program *)fname.field_2._8_8_);
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter,pvVar10);
    __gnu_cxx::
    __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>::
    __normal_iterator(&local_4f8);
    local_4f8._M_current =
         (t_typedef **)
         std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::begin
                   ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
    while( true ) {
      name_2.field_2._8_8_ =
           std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::end
                     ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_4f8,
                         (__normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>
                          *)((long)&name_2.field_2 + 8));
      if (!bVar1) break;
      pptVar11 = __gnu_cxx::
                 __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>
                 ::operator*(&local_4f8);
      psVar3 = t_typedef::get_symbolic_abi_cxx11_(*pptVar11);
      std::__cxx11::string::string((string *)(html_2.field_2._M_local_buf + 8),(string *)psVar3);
      std::__cxx11::string::string((string *)&local_628,(string *)local_38);
      make_file_link(&local_608,this,&local_628);
      std::operator+(&local_5e8,"<a href=\"",&local_608);
      std::operator+(&local_5c8,&local_5e8,"#Typedef_");
      std::operator+(&local_5a8,&local_5c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&html_2.field_2 + 8));
      std::operator+(&local_588,&local_5a8,"\">");
      std::operator+(&local_568,&local_588,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&html_2.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548,
                     &local_568,"</a>");
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::string::~string((string *)&local_608);
      std::__cxx11::string::~string((string *)&local_628);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_668,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&html_2.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548);
      std::
      map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,&local_668);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_668);
      std::__cxx11::string::~string((string *)local_548);
      std::__cxx11::string::~string((string *)(html_2.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>::
      operator++(&local_4f8);
    }
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::~vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
  }
  pvVar12 = t_program::get_objects((t_program *)fname.field_2._8_8_);
  bVar1 = std::vector<t_struct_*,_std::allocator<t_struct_*>_>::empty(pvVar12);
  if (!bVar1) {
    pvVar12 = t_program::get_objects((t_program *)fname.field_2._8_8_);
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter,pvVar12);
    __gnu_cxx::__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
    ::__normal_iterator(&local_698);
    local_698._M_current =
         (t_struct **)
         std::vector<t_struct_*,_std::allocator<t_struct_*>_>::begin
                   ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
    while( true ) {
      name_3.field_2._8_8_ =
           std::vector<t_struct_*,_std::allocator<t_struct_*>_>::end
                     ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_698,
                         (__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                          *)((long)&name_3.field_2 + 8));
      if (!bVar1) break;
      pptVar13 = __gnu_cxx::
                 __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                 ::operator*(&local_698);
      iVar2 = (*((*pptVar13)->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::__cxx11::string::string
                ((string *)(html_3.field_2._M_local_buf + 8),
                 (string *)CONCAT44(extraout_var_00,iVar2));
      std::__cxx11::string::string((string *)&local_7c8,(string *)local_38);
      make_file_link(&local_7a8,this,&local_7c8);
      std::operator+(&local_788,"<a href=\"",&local_7a8);
      std::operator+(&local_768,&local_788,"#Struct_");
      std::operator+(&local_748,&local_768,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&html_3.field_2 + 8));
      std::operator+(&local_728,&local_748,"\">");
      std::operator+(&local_708,&local_728,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&html_3.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e8,
                     &local_708,"</a>");
      std::__cxx11::string::~string((string *)&local_708);
      std::__cxx11::string::~string((string *)&local_728);
      std::__cxx11::string::~string((string *)&local_748);
      std::__cxx11::string::~string((string *)&local_768);
      std::__cxx11::string::~string((string *)&local_788);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_808,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&html_3.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e8);
      std::
      map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,&local_808);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_808);
      std::__cxx11::string::~string((string *)local_6e8);
      std::__cxx11::string::~string((string *)(html_3.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>::
      operator++(&local_698);
    }
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::~vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
  }
  this_01 = &enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)this_01);
  data_type = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)this_01);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&data_type);
    if (!bVar1) break;
    ppVar16 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator*(&__end1);
    poVar4 = std::operator<<((ostream *)&this->f_out_,(string *)&ppVar16->second);
    poVar4 = std::operator<<(poVar4,"<br/>");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  poVar4 = std::operator<<((ostream *)&this->f_out_,"</td>");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,"<td>");
  pvVar14 = t_program::get_consts((t_program *)fname.field_2._8_8_);
  bVar1 = std::vector<t_const_*,_std::allocator<t_const_*>_>::empty(pvVar14);
  if (!bVar1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
    pvVar14 = t_program::get_consts((t_program *)fname.field_2._8_8_);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)&con_iter,pvVar14);
    __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
    __normal_iterator(&local_888);
    local_888._M_current =
         (t_const **)
         std::vector<t_const_*,_std::allocator<t_const_*>_>::begin
                   ((vector<t_const_*,_std::allocator<t_const_*>_> *)&con_iter);
    while( true ) {
      name_4.field_2._8_8_ =
           std::vector<t_const_*,_std::allocator<t_const_*>_>::end
                     ((vector<t_const_*,_std::allocator<t_const_*>_> *)&con_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_888,
                         (__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
                          *)((long)&name_4.field_2 + 8));
      if (!bVar1) break;
      pptVar15 = __gnu_cxx::
                 __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
                 ::operator*(&local_888);
      t_const::get_name_abi_cxx11_((string *)((long)&html_4.field_2 + 8),*pptVar15);
      std::__cxx11::string::string((string *)&local_9b8,(string *)local_38);
      make_file_link(&local_998,this,&local_9b8);
      std::operator+(&local_978,"<code><a href=\"",&local_998);
      std::operator+(&local_958,&local_978,"#Const_");
      std::operator+(&local_938,&local_958,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&html_4.field_2 + 8));
      std::operator+(&local_918,&local_938,"\">");
      std::operator+(&local_8f8,&local_918,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&html_4.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8d8,
                     &local_8f8,"</a></code>");
      std::__cxx11::string::~string((string *)&local_8f8);
      std::__cxx11::string::~string((string *)&local_918);
      std::__cxx11::string::~string((string *)&local_938);
      std::__cxx11::string::~string((string *)&local_958);
      std::__cxx11::string::~string((string *)&local_978);
      std::__cxx11::string::~string((string *)&local_998);
      std::__cxx11::string::~string((string *)&local_9b8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_9f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&html_4.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8d8);
      std::
      map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,&local_9f8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_9f8);
      std::__cxx11::string::~string((string *)local_8d8);
      std::__cxx11::string::~string((string *)(html_4.field_2._M_local_buf + 8));
      __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
      ::operator++(&local_888);
    }
    this_02 = &consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this_02);
    con_iter_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this_02);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&con_iter_1);
      if (!bVar1) break;
      ppVar16 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end2);
      poVar4 = std::operator<<((ostream *)&this->f_out_,(string *)&ppVar16->second);
      poVar4 = std::operator<<(poVar4,"<br/>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
    std::vector<t_const_*,_std::allocator<t_const_*>_>::~vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)&con_iter);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  }
  poVar4 = std::operator<<((ostream *)&this->f_out_,"</td>");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,"</tr>");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_html_generator::generate_program_toc_row(t_program* tprog) {
  string fname = tprog->get_name() + ".html";
  f_out_ << "<tr>" << endl << "<td>" << tprog->get_name() << "</td><td>";
  if (!tprog->get_services().empty()) {
    vector<t_service*> services = tprog->get_services();
    vector<t_service*>::iterator sv_iter;
    for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
      string name = get_service_name(*sv_iter);
      f_out_ << "<a href=\"" << make_file_link(fname) << "#Svc_" << name << "\">" << name
             << "</a><br/>" << endl;
      f_out_ << "<ul>" << endl;
      map<string, string> fn_html;
      vector<t_function*> functions = (*sv_iter)->get_functions();
      vector<t_function*>::iterator fn_iter;
      for (fn_iter = functions.begin(); fn_iter != functions.end(); ++fn_iter) {
        string fn_name = (*fn_iter)->get_name();
        string html = "<li><a href=\"" + make_file_link(fname) + "#Fn_" + name + "_" + fn_name
                      + "\">" + fn_name + "</a></li>";
        fn_html.insert(pair<string, string>(fn_name, html));
      }
      for (auto & html_iter : fn_html) {
        f_out_ << html_iter.second << endl;
      }
      f_out_ << "</ul>" << endl;
    }
  }
  f_out_ << "</td>" << endl << "<td>";
  map<string, string> data_types;
  if (!tprog->get_enums().empty()) {
    vector<t_enum*> enums = tprog->get_enums();
    vector<t_enum*>::iterator en_iter;
    for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
      string name = (*en_iter)->get_name();
      // f_out_ << "<a href=\"" << make_file_link(fname) << "#Enum_" << name << "\">" << name
      // <<  "</a><br/>" << endl;
      string html = "<a href=\"" + make_file_link(fname) + "#Enum_" + name + "\">" + name + "</a>";
      data_types.insert(pair<string, string>(name, html));
    }
  }
  if (!tprog->get_typedefs().empty()) {
    vector<t_typedef*> typedefs = tprog->get_typedefs();
    vector<t_typedef*>::iterator td_iter;
    for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
      string name = (*td_iter)->get_symbolic();
      // f_out_ << "<a href=\"" << make_file_link(fname) << "#Typedef_" << name << "\">" << name
      // << "</a><br/>" << endl;
      string html = "<a href=\"" + make_file_link(fname) + "#Typedef_" + name + "\">" + name
                    + "</a>";
      data_types.insert(pair<string, string>(name, html));
    }
  }
  if (!tprog->get_objects().empty()) {
    vector<t_struct*> objects = tprog->get_objects();
    vector<t_struct*>::iterator o_iter;
    for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
      string name = (*o_iter)->get_name();
      // f_out_ << "<a href=\"" << make_file_link(fname) << "#Struct_" << name << "\">" << name
      //<< "</a><br/>" << endl;
      string html = "<a href=\"" + make_file_link(fname) + "#Struct_" + name + "\">" + name
                    + "</a>";
      data_types.insert(pair<string, string>(name, html));
    }
  }
  for (auto & data_type : data_types) {
    f_out_ << data_type.second << "<br/>" << endl;
  }
  f_out_ << "</td>" << endl << "<td>";
  if (!tprog->get_consts().empty()) {
    map<string, string> const_html;
    vector<t_const*> consts = tprog->get_consts();
    vector<t_const*>::iterator con_iter;
    for (con_iter = consts.begin(); con_iter != consts.end(); ++con_iter) {
      string name = (*con_iter)->get_name();
      string html = "<code><a href=\"" + make_file_link(fname) + "#Const_" + name + "\">" + name
                    + "</a></code>";
      const_html.insert(pair<string, string>(name, html));
    }
    for (auto & con_iter : const_html) {
      f_out_ << con_iter.second << "<br/>" << endl;
    }
  }
  f_out_ << "</td>" << endl << "</tr>";
}